

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_quantization.cc
# Opt level: O0

void __thiscall
sptk::UniformQuantization::UniformQuantization
          (UniformQuantization *this,double absolute_maximum_value,int num_bit,
          QuantizationType quantization_type)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  __type _Var1;
  
  *in_RDI = &PTR__UniformQuantization_00126cc8;
  in_RDI[1] = in_XMM0_Qa;
  *(undefined4 *)(in_RDI + 2) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0x14) = in_EDX;
  *(undefined1 *)(in_RDI + 3) = 1;
  if (((double)in_RDI[1] <= 0.0) || (*(int *)(in_RDI + 2) < 1)) {
    *(undefined1 *)(in_RDI + 3) = 0;
  }
  else {
    if (*(int *)((long)in_RDI + 0x14) == 0) {
      _Var1 = std::pow<double,int>((double)in_RDI,0);
      *(int *)((long)in_RDI + 0x1c) = (int)_Var1;
    }
    else {
      if (*(int *)((long)in_RDI + 0x14) != 1) {
        *(undefined1 *)(in_RDI + 3) = 0;
        return;
      }
      _Var1 = std::pow<double,int>((double)in_RDI,1);
      *(int *)((long)in_RDI + 0x1c) = (int)_Var1 + -1;
    }
    in_RDI[4] = (double)*(int *)((long)in_RDI + 0x1c) / ((double)in_RDI[1] * 2.0);
  }
  return;
}

Assistant:

UniformQuantization::UniformQuantization(double absolute_maximum_value,
                                         int num_bit,
                                         QuantizationType quantization_type)
    : absolute_maximum_value_(absolute_maximum_value),
      num_bit_(num_bit),
      quantization_type_(quantization_type),
      is_valid_(true) {
  if (absolute_maximum_value_ <= 0.0 || num_bit_ <= 0) {
    is_valid_ = false;
    return;
  }

  switch (quantization_type_) {
    case kMidRise: {
      quantization_levels_ = static_cast<int>(std::pow(2.0, num_bit_));
      break;
    }
    case kMidTread: {
      quantization_levels_ = static_cast<int>(std::pow(2.0, num_bit_)) - 1;
      break;
    }
    default: {
      is_valid_ = false;
      return;
    }
  }

  inverse_step_size_ = quantization_levels_ / (2.0 * absolute_maximum_value_);
}